

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O2

size_t xmi_process_INFO(PBuffer *buffer,MidiFile *param_2)

{
  ushort uVar1;
  element_type *peVar2;
  Stream *pSVar3;
  string *this;
  uint16_t track_count;
  ushort local_5a;
  undefined1 local_58 [16];
  string local_48 [32];
  string local_28 [32];
  
  peVar2 = (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2->size == 2) {
    uVar1 = *(ushort *)peVar2->read;
    peVar2->read = (uint8_t *)((long)peVar2->read + 2);
    local_5a = uVar1 << 8 | uVar1 >> 8;
    if (peVar2->endianess != EndianessBig) {
      local_5a = uVar1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              (local_48,"xmi2mid",(allocator<char> *)(local_58 + 0xf));
    Log::Logger::operator[]((Logger *)local_58,(string *)&Log::Verbose);
    pSVar3 = Log::Stream::operator<<((Stream *)local_58,"\tXMI contains ");
    pSVar3 = Log::Stream::operator<<(pSVar3,&local_5a);
    Log::Stream::operator<<(pSVar3," track(s)");
    Log::Stream::~Stream((Stream *)local_58);
    this = local_48;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              (local_28,"xmi2mid",(allocator<char> *)&local_5a);
    Log::Logger::operator[]((Logger *)local_58,(string *)&Log::Debug);
    Log::Stream::operator<<((Stream *)local_58,"\tInconsistent INFO block.");
    Log::Stream::~Stream((Stream *)local_58);
    this = local_28;
  }
  std::__cxx11::string::~string(this);
  return ((buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->size;
}

Assistant:

static size_t
xmi_process_INFO(PBuffer buffer, MidiFile * /*midi*/) {
  if (buffer->get_size() != 2) {
    Log::Debug["xmi2mid"] << "\tInconsistent INFO block.";
  } else {
    uint16_t track_count = buffer->pop<uint16_t>();
    Log::Verbose["xmi2mid"] << "\tXMI contains " << track_count << " track(s)";
  }
  return buffer->get_size();
}